

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O0

void Prf_ManAddSaved(Prf_Man_t *p,int i,int iNew)

{
  int iVar1;
  int iNew_local;
  int i_local;
  Prf_Man_t *p_local;
  
  if (p->iFirst < 0) {
    __assert_fail("p->iFirst >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xb1,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
  }
  if (p->iFirst <= i) {
    iVar1 = Vec_IntSize(p->vSaved);
    if (iVar1 == 0) {
      if (p->iFirst2 != -1) {
        __assert_fail("p->iFirst2 == -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xb6,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
      }
      p->iFirst2 = iNew;
    }
    Vec_IntPush(p->vSaved,i);
  }
  return;
}

Assistant:

static inline void Prf_ManAddSaved( Prf_Man_t * p, int i, int iNew )
{
    assert( p->iFirst >= 0 );
    if ( i < p->iFirst )
        return;
    if ( Vec_IntSize(p->vSaved) == 0 )
    {
        assert( p->iFirst2 == -1 );
        p->iFirst2 = iNew;
    }
    Vec_IntPush( p->vSaved, i );
}